

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O2

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/array_object.cpp:561:57)>
::call(value *__return_storage_ptr__,
      impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_array_object_cpp:561:57)>
      *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  anon_class_16_1_570cf4e1_for_f *this_00;
  gc_heap *h;
  bool bVar1;
  uint32_t uVar2;
  value *v;
  gc_heap_ptr_untyped *this_01;
  undefined8 *puVar3;
  object *this_02;
  long *plVar4;
  long *plVar5;
  uint32_t index;
  undefined8 extraout_RDX;
  undefined8 uVar6;
  undefined8 extraout_RDX_00;
  uint uVar7;
  string last_idx;
  undefined1 local_a0 [40];
  string this_idx;
  undefined1 local_50 [16];
  
  this_00 = &this->f;
  v = (value *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
  global_object::validate_object((global_object *)&stack0xffffffffffffffc0,v);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&stack0xffffffffffffffc0);
  this_01 = &value::object_value(this_)->super_gc_heap_ptr_untyped;
  h = (this->f).global.super_gc_heap_ptr_untyped.heap_;
  puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_01);
  last_idx.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)0x6;
  last_idx.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = L"length";
  (**(code **)*puVar3)((value *)local_a0);
  uVar2 = to_uint32((value *)local_a0);
  value::~value((value *)local_a0);
  if (uVar2 == 0) {
    plVar4 = (long *)gc_heap_ptr_untyped::get(this_01);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
    (**(code **)(*plVar5 + 0x98))(&last_idx,plVar5,"length");
    local_a0._0_4_ = 3;
    local_a0._8_8_ = 0;
    (**(code **)(*plVar4 + 8))(plVar4,&last_idx,local_a0,0);
    value::~value((value *)local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&last_idx);
    value::value(__return_storage_ptr__,(value *)&value::undefined);
  }
  else {
    index_string_abi_cxx11_((wstring *)local_a0,(mjs *)0x0,index);
    this_idx.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ =
         (gc_heap *)local_a0._8_8_;
    this_idx.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = local_a0._0_8_;
    string::string(&last_idx,h,(wstring_view *)&this_idx);
    std::__cxx11::wstring::~wstring((wstring *)local_a0);
    puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_01);
    local_a0._0_16_ = (undefined1  [16])string::view(&last_idx);
    (**(code **)*puVar3)(__return_storage_ptr__,puVar3,local_a0);
    uVar6 = extraout_RDX;
    for (uVar7 = 1; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      index_string_abi_cxx11_((wstring *)local_a0,(mjs *)(ulong)uVar7,(uint32_t)uVar6);
      local_50._8_8_ = local_a0._0_8_;
      local_50._0_8_ = local_a0._8_8_;
      string::string(&this_idx,h,(wstring_view *)local_50);
      std::__cxx11::wstring::~wstring((wstring *)local_a0);
      this_02 = (object *)gc_heap_ptr_untyped::get(this_01);
      local_a0._0_16_ = (undefined1  [16])string::view(&this_idx);
      bVar1 = object::has_property(this_02,(wstring_view *)local_a0);
      if (bVar1) {
        plVar4 = (long *)gc_heap_ptr_untyped::get(this_01);
        puVar3 = (undefined8 *)gc_heap_ptr_untyped::get(this_01);
        local_50 = (undefined1  [16])string::view(&this_idx);
        (**(code **)*puVar3)((value *)local_a0,puVar3,local_50);
        (**(code **)(*plVar4 + 8))(plVar4,&last_idx,(value *)local_a0,0);
        value::~value((value *)local_a0);
      }
      else {
        plVar4 = (long *)gc_heap_ptr_untyped::get(this_01);
        local_a0._0_16_ = (undefined1  [16])string::view(&last_idx);
        (**(code **)(*plVar4 + 0x10))(plVar4,(value *)local_a0);
      }
      gc_heap_ptr_untyped::operator=
                ((gc_heap_ptr_untyped *)&last_idx,(gc_heap_ptr_untyped *)&this_idx);
      gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&this_idx);
      uVar6 = extraout_RDX_00;
    }
    plVar4 = (long *)gc_heap_ptr_untyped::get(this_01);
    plVar5 = (long *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this_00);
    (**(code **)(*plVar5 + 0x98))(&this_idx,plVar5,"length");
    local_a0._0_4_ = 3;
    local_a0._8_8_ = (double)(uVar2 - 1);
    (**(code **)(*plVar4 + 8))(plVar4,&this_idx,local_a0,0);
    value::~value((value *)local_a0);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&this_idx);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&last_idx);
  }
  return __return_storage_ptr__;
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }